

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::batch_normalize_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar10;
  fatal_error *this;
  long lVar11;
  long lVar12;
  size_t new_size;
  long lVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  ostringstream dlib_o_out;
  long local_1e8;
  long local_1e0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  if (gamma->m_n == 1) {
    lVar11 = gamma->m_nr;
    lVar12 = src->m_nr;
    if (lVar11 == lVar12) {
      lVar13 = gamma->m_nc;
      lVar14 = src->m_nc;
      if (lVar13 == lVar14) {
        lVar4 = gamma->m_k;
        lVar5 = src->m_k;
        if (((((lVar4 == lVar5) && (beta->m_n == 1)) && (lVar4 == beta->m_k)) &&
            (((lVar11 == beta->m_nr && (lVar13 == beta->m_nc)) &&
             ((running_means->m_n == 1 &&
              ((lVar4 == running_means->m_k && (lVar11 == running_means->m_nr)))))))) &&
           (lVar13 == running_means->m_nc)) {
          bVar15 = false;
          if (((running_variances->m_n == 1) && (bVar15 = false, lVar4 == running_variances->m_k))
             && (lVar11 == running_variances->m_nr)) {
            bVar15 = lVar13 == running_variances->m_nc;
          }
          if ((0.0 < eps) && (bVar15)) {
            lVar11 = src->m_n;
            (dest->super_tensor).m_n = lVar11;
            (dest->super_tensor).m_k = lVar5;
            (dest->super_tensor).m_nr = lVar12;
            (dest->super_tensor).m_nc = lVar14;
            new_size = lVar5 * lVar11 * lVar14 * lVar12;
            (dest->super_tensor).m_size = new_size;
            gpu_data::set_size(&dest->data_instance,new_size);
            iVar6 = (*(dest->super_tensor)._vptr_tensor[3])(dest);
            local_1e0 = CONCAT44(extraout_var,iVar6);
            iVar6 = (*src->_vptr_tensor[2])(src);
            local_1e8 = CONCAT44(extraout_var_00,iVar6);
            iVar6 = (*gamma->_vptr_tensor[2])(gamma);
            iVar7 = (*beta->_vptr_tensor[2])(beta);
            iVar8 = (*running_means->_vptr_tensor[2])(running_means);
            iVar9 = (*running_variances->_vptr_tensor[2])(running_variances);
            if (0 < src->m_n) {
              lVar12 = src->m_nr * src->m_k * src->m_nc;
              lVar11 = 0;
              do {
                if (0 < lVar12) {
                  lVar13 = 0;
                  lVar14 = 0;
                  do {
                    fVar1 = *(float *)(local_1e8 + lVar14 * 4);
                    fVar2 = *(float *)(CONCAT44(extraout_var_03,iVar8) + lVar14 * 4);
                    fVar3 = *(float *)(CONCAT44(extraout_var_01,iVar6) + lVar14 * 4);
                    dVar16 = (double)*(float *)(CONCAT44(extraout_var_04,iVar9) + lVar14 * 4) + eps;
                    if (dVar16 < 0.0) {
                      dVar16 = sqrt(dVar16);
                    }
                    else {
                      dVar16 = SQRT(dVar16);
                    }
                    *(float *)(local_1e0 + lVar14 * 4) =
                         (float)((double)*(float *)(CONCAT44(extraout_var_02,iVar7) + lVar14 * 4) +
                                (double)((fVar1 - fVar2) * fVar3) / dVar16);
                    lVar14 = lVar14 + 1;
                    lVar13 = lVar13 + -4;
                  } while (lVar12 - lVar14 != 0);
                  local_1e0 = local_1e0 - lVar13;
                  local_1e8 = local_1e8 - lVar13;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < src->m_n);
            }
            return;
          }
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar10 = (ostream *)std::ostream::operator<<(local_1a8,0x2ae);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::cpu::batch_normalize_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
             ,0x9b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "gamma.num_samples() == 1 && gamma.nr() == src.nr() && gamma.nc() == src.nc() && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
             ,0xf4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\ngamma.num_samples(): ",0x16);
  poVar10 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ngamma.k():  ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ngamma.nr(): ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ngamma.nc(): ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nbeta.num_samples(): ",0x15);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nbeta.k():   ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nbeta.nr():  ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nbeta.nc():  ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_means.num_samples(): ",0x1e)
  ;
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_means.k():   ",0x16);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_means.nr():  ",0x16);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_means.nc():  ",0x16);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"\nrunning_variances.num_samples(): ",0x22);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_variances.k():   ",0x1a);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_variances.nr():  ",0x1a);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nrunning_variances.nc():  ",0x1a);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nsrc.k():   ",0xc);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nsrc.nr():  ",0xc);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nsrc.nc():  ",0xc);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\neps:  ",7);
  poVar10 = std::ostream::_M_insert<double>(eps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void batch_normalize_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == src.nr() &&
                gamma.nc() == src.nc() &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) && 
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.k()*src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < num; ++k)
                {
                    *d = g[k]*(*s - m[k])/std::sqrt(v[k]+eps) + b[k];
                    ++d;
                    ++s;
                }
            }
        }